

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::CompilerGLSL::fixup_image_load_store_access(CompilerGLSL *this)

{
  ID id;
  size_t sVar1;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRType *pSVar5;
  long lVar6;
  LoopLock local_30;
  
  if ((this->options).enable_storage_image_qualifier_deduction == true) {
    ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
    sVar1 = (this->super_Compiler).ir.ids_for_type[2].
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
            buffer_size;
    if (sVar1 != 0) {
      pTVar2 = (this->super_Compiler).ir.ids_for_type[2].
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
      lVar6 = 0;
      do {
        id.id = *(uint32_t *)((long)&pTVar2->id + lVar6);
        pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
        if (pVVar3[id.id].type == TypeVariable) {
          Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar3 + id.id);
          pSVar5 = Compiler::expression_type(&this->super_Compiler,id.id);
          if ((pSVar5->basetype == Image) && ((pSVar5->image).sampled == 2)) {
            bVar4 = Compiler::has_decoration(&this->super_Compiler,id,DecorationNonWritable);
            if (!bVar4) {
              bVar4 = Compiler::has_decoration(&this->super_Compiler,id,DecorationNonReadable);
              if (!bVar4) {
                Compiler::set_decoration(&this->super_Compiler,id,DecorationNonWritable,0);
                Compiler::set_decoration(&this->super_Compiler,id,DecorationNonReadable,0);
              }
            }
          }
        }
        lVar6 = lVar6 + 4;
      } while (sVar1 << 2 != lVar6);
    }
    ParsedIR::LoopLock::~LoopLock(&local_30);
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_image_load_store_access()
{
	if (!options.enable_storage_image_qualifier_deduction)
		return;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var, const SPIRVariable &) {
		auto &vartype = expression_type(var);
		if (vartype.basetype == SPIRType::Image && vartype.image.sampled == 2)
		{
			// Very old glslangValidator and HLSL compilers do not emit required qualifiers here.
			// Solve this by making the image access as restricted as possible and loosen up if we need to.
			// If any no-read/no-write flags are actually set, assume that the compiler knows what it's doing.

			if (!has_decoration(var, DecorationNonWritable) && !has_decoration(var, DecorationNonReadable))
			{
				set_decoration(var, DecorationNonWritable);
				set_decoration(var, DecorationNonReadable);
			}
		}
	});
}